

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

int int_x509_param_set1(char **pdest,size_t *pdestlen,char *src,size_t srclen)

{
  char *pcVar1;
  void *tmp;
  size_t srclen_local;
  char *src_local;
  size_t *pdestlen_local;
  char **pdest_local;
  
  if ((src == (char *)0x0) || (srclen == 0)) {
    pdest_local._4_4_ = 0;
  }
  else {
    pcVar1 = (char *)OPENSSL_memdup(src,srclen);
    if (pcVar1 == (char *)0x0) {
      pdest_local._4_4_ = 0;
    }
    else {
      if (*pdest != (char *)0x0) {
        OPENSSL_free(*pdest);
      }
      *pdest = pcVar1;
      if (pdestlen != (size_t *)0x0) {
        *pdestlen = srclen;
      }
      pdest_local._4_4_ = 1;
    }
  }
  return pdest_local._4_4_;
}

Assistant:

static int int_x509_param_set1(char **pdest, size_t *pdestlen, const char *src,
                               size_t srclen) {
  void *tmp;
  if (src == NULL || srclen == 0) {
    // Unlike OpenSSL, we do not allow an empty string to disable previously
    // configured checks.
    return 0;
  }

  tmp = OPENSSL_memdup(src, srclen);
  if (!tmp) {
    return 0;
  }

  if (*pdest) {
    OPENSSL_free(*pdest);
  }
  *pdest = reinterpret_cast<char *>(tmp);
  if (pdestlen) {
    *pdestlen = srclen;
  }
  return 1;
}